

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O3

void __thiscall
de::ArrayBuffer<int,_4UL,_4UL>::ArrayBuffer
          (ArrayBuffer<int,_4UL,_4UL> *this,ArrayBuffer<int,_4UL,_4UL> *other)

{
  size_t sVar1;
  void *ptr;
  void *__dest;
  size_t otherCap;
  void *otherPtr;
  
  this->m_ptr = (void *)0x0;
  this->m_cap = 0;
  sVar1 = other->m_cap;
  if (sVar1 != 0) {
    __dest = detail::ArrayBuffer_AlignedMalloc(sVar1 * 4,4);
    memcpy(__dest,other->m_ptr,(long)((int)sVar1 * 4));
    ptr = this->m_ptr;
    this->m_ptr = __dest;
    this->m_cap = sVar1;
    deAlignedFree(ptr);
  }
  return;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>::ArrayBuffer (const ArrayBuffer<T,Alignment,Stride>& other)
	: m_ptr	(DE_NULL)
	, m_cap	(0)
{
	if (other.m_cap)
	{
		// copy to temporary and swap to it

		const size_t	storageSize =	(other.m_cap - 1) * Stride + sizeof(T);
		ArrayBuffer		tmp				(other.m_cap);

		deMemcpy(tmp.m_ptr, other.m_ptr, (int)storageSize);
		swap(tmp);
	}
}